

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O2

token * dmrC_conditional_expression(dmr_C *C,token *token,expression **tree)

{
  expression **tree_00;
  expression **tree_01;
  byte bVar5;
  token *ptVar1;
  expression *peVar2;
  char *pcVar3;
  expression *peVar4;
  expression *peVar6;
  expression *local_48;
  expression *local_40;
  expression *right;
  
  local_48 = (expression *)0x0;
  ptVar1 = logical_and_expression(C,token,&local_48);
  if (local_48 == (expression *)0x0) {
    *tree = (expression *)0x0;
  }
  else {
    peVar6 = local_48;
    right = (expression *)tree;
    while( true ) {
      if (((SUB84(ptVar1->pos,0) & 0x3f) != 0x11) ||
         (local_40 = (expression *)0x0, (ptVar1->field_2).special != 0x10e)) goto LAB_00108644;
      peVar2 = dmrC_alloc_expression(C,ptVar1->pos,7);
      ptVar1 = logical_and_expression(C,ptVar1->next,&local_40);
      if (local_40 == (expression *)0x0) break;
      peVar2->field_0x1 =
           (byte)((ushort)*(undefined2 *)peVar6 >> 8) & (byte)((ushort)*(undefined2 *)local_40 >> 8)
           & 1;
      peVar2->op = 0x10e;
      (peVar2->field_5).field_3.unop = peVar6;
      (peVar2->field_5).field_2.string = (string *)local_40;
      peVar6 = peVar2;
    }
    pcVar3 = dmrC_show_special(C,0x10e);
    dmrC_sparse_error(C,ptVar1->pos,"No right hand side of \'%s\'-expression",pcVar3);
LAB_00108644:
    peVar2 = right;
    *(expression **)right = peVar6;
    if (((SUB84(ptVar1->pos,0) & 0x3f) == 0x11) && ((ptVar1->field_2).special == 0x3f)) {
      peVar4 = dmrC_alloc_expression(C,ptVar1->pos,0x11);
      peVar4->op = (ptVar1->field_2).special;
      (peVar4->field_5).field_12.label_symbol = *(symbol **)peVar2;
      *(expression **)peVar2 = peVar4;
      tree_00 = &(peVar4->field_5).field_6.right;
      ptVar1 = comma_expression(C,ptVar1->next,tree_00);
      ptVar1 = dmrC_expect_token(C,ptVar1,0x3a,"in conditional expression");
      tree_01 = &(peVar4->field_5).field_10.cond_false;
      ptVar1 = dmrC_conditional_expression(C,ptVar1,tree_01);
      peVar6 = (peVar4->field_5).field_3.unop;
      if ((peVar6 != (expression *)0x0) && (peVar2 = *tree_01, peVar2 != (expression *)0x0)) {
        bVar5 = (byte)((ushort)*(undefined2 *)peVar2 >> 8) &
                (byte)((ushort)*(undefined2 *)peVar6 >> 8);
        peVar6 = *tree_00;
        if (peVar6 != (expression *)0x0) {
          bVar5 = bVar5 & (byte)((ushort)*(undefined2 *)peVar6 >> 8);
        }
        peVar4->field_0x1 = bVar5 & 1;
      }
    }
  }
  return ptVar1;
}

Assistant:

struct token *dmrC_conditional_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	token = logical_or_expression(C, token, tree);
	if (*tree && dmrC_match_op(token, '?')) {
		struct expression *expr = dmrC_alloc_expression(C, token->pos, EXPR_CONDITIONAL);
		expr->op = token->special;
		expr->left = *tree;
		*tree = expr;
		token = dmrC_parse_expression(C, token->next, &expr->cond_true);
		token = dmrC_expect_token(C, token, ':', "in conditional expression");
		token = dmrC_conditional_expression(C, token, &expr->cond_false);
		if (expr->left && expr->cond_false) {
			int is_const = expr->left->flags &
					expr->cond_false->flags &
					Int_const_expr;
			if (expr->cond_true)
				is_const &= expr->cond_true->flags;
			expr->flags = is_const;
		}
	}
	return token;
}